

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O0

UChar __thiscall
icu_63::FCDUIterCollationIterator::handleGetTrailSurrogate(FCDUIterCollationIterator *this)

{
  uint uVar1;
  UChar trail_1;
  UChar32 trail;
  FCDUIterCollationIterator *this_local;
  
  if ((int)this->state < 3) {
    uVar1 = (*(code *)((this->super_UIterCollationIterator).iter)->next)
                      ((this->super_UIterCollationIterator).iter);
    if ((uVar1 & 0xfffffc00) == 0xdc00) {
      if (this->state == ITER_IN_FCD_SEGMENT) {
        this->pos = this->pos + 1;
      }
    }
    else if (-1 < (int)uVar1) {
      (*(code *)((this->super_UIterCollationIterator).iter)->previous)
                ((this->super_UIterCollationIterator).iter);
    }
    this_local._6_2_ = (char16_t)uVar1;
  }
  else {
    this_local._6_2_ = icu_63::UnicodeString::operator[](&this->normalized,this->pos);
    if ((this_local._6_2_ & 0xfc00U) == 0xdc00) {
      this->pos = this->pos + 1;
    }
  }
  return this_local._6_2_;
}

Assistant:

UChar
FCDUIterCollationIterator::handleGetTrailSurrogate() {
    if(state <= ITER_IN_FCD_SEGMENT) {
        UChar32 trail = iter.next(&iter);
        if(U16_IS_TRAIL(trail)) {
            if(state == ITER_IN_FCD_SEGMENT) { ++pos; }
        } else if(trail >= 0) {
            iter.previous(&iter);
        }
        return (UChar)trail;
    } else {
        U_ASSERT(pos < normalized.length());
        UChar trail;
        if(U16_IS_TRAIL(trail = normalized[pos])) { ++pos; }
        return trail;
    }
}